

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorBuilder::ValidateMessageOptions
          (DescriptorBuilder *this,Descriptor *message,DescriptorProto *proto)

{
  long lVar1;
  string *element_name;
  Type *pTVar2;
  Type *proto_00;
  Type *proto_01;
  Type *descriptor;
  size_t sVar3;
  long lVar4;
  long lVar5;
  SubstituteArg *in_stack_fffffffffffffda8;
  string local_230;
  char *local_210;
  undefined4 local_208;
  char local_204 [36];
  SubstituteArg local_1e0;
  SubstituteArg local_1b0;
  SubstituteArg local_180;
  SubstituteArg local_150;
  SubstituteArg local_120;
  SubstituteArg local_f0;
  SubstituteArg local_c0;
  SubstituteArg local_90;
  SubstituteArg local_60;
  
  if (0 < *(int *)(message + 0x2c)) {
    lVar4 = 0;
    lVar5 = 0;
    do {
      lVar1 = *(long *)(message + 0x30);
      pTVar2 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                         (&(proto->field_).super_RepeatedPtrFieldBase,(int)lVar5);
      ValidateFieldOptions(this,(FieldDescriptor *)(lVar1 + lVar4),pTVar2);
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 0xa8;
    } while (lVar5 < *(int *)(message + 0x2c));
  }
  if (0 < *(int *)(message + 0x48)) {
    lVar4 = 0;
    lVar5 = 0;
    do {
      lVar1 = *(long *)(message + 0x50);
      proto_00 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                           (&(proto->nested_type_).super_RepeatedPtrFieldBase,(int)lVar5);
      ValidateMessageOptions(this,(Descriptor *)(lVar1 + lVar4),proto_00);
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 0xa8;
    } while (lVar5 < *(int *)(message + 0x48));
  }
  if (0 < *(int *)(message + 0x58)) {
    lVar4 = 0;
    lVar5 = 0;
    do {
      lVar1 = *(long *)(message + 0x60);
      proto_01 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
                           (&(proto->enum_type_).super_RepeatedPtrFieldBase,(int)lVar5);
      ValidateEnumOptions(this,(EnumDescriptor *)(lVar1 + lVar4),proto_01);
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 0x38;
    } while (lVar5 < *(int *)(message + 0x58));
  }
  if (0 < *(int *)(message + 0x78)) {
    lVar4 = 0;
    lVar5 = 0;
    do {
      lVar1 = *(long *)(message + 0x80);
      pTVar2 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                         (&(proto->extension_).super_RepeatedPtrFieldBase,(int)lVar5);
      ValidateFieldOptions(this,(FieldDescriptor *)(lVar1 + lVar4),pTVar2);
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 0xa8;
    } while (lVar5 < *(int *)(message + 0x78));
  }
  lVar4 = 0x1fffffff;
  if (*(char *)(*(long *)(message + 0x20) + 0x68) != '\0') {
    lVar4 = 0x7fffffff;
  }
  if (0 < *(int *)(message + 0x68)) {
    lVar5 = 0;
    do {
      if (lVar4 + 1 < (long)*(int *)(*(long *)(message + 0x70) + 4 + lVar5 * 8)) {
        element_name = *(string **)(message + 8);
        descriptor = internal::RepeatedPtrFieldBase::
                     Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::TypeHandler>
                               (&(proto->extension_range_).super_RepeatedPtrFieldBase,(int)lVar5);
        local_210 = FastInt64ToBuffer(lVar4,local_204);
        sVar3 = strlen(local_210);
        local_208 = (undefined4)sVar3;
        local_60.text_ = (char *)0x0;
        local_60.size_ = -1;
        local_90.text_ = (char *)0x0;
        local_90.size_ = -1;
        local_c0.text_ = (char *)0x0;
        local_c0.size_ = -1;
        local_f0.text_ = (char *)0x0;
        local_f0.size_ = -1;
        local_120.text_ = (char *)0x0;
        local_120.size_ = -1;
        local_150.text_ = (char *)0x0;
        local_150.size_ = -1;
        local_180.text_ = (char *)0x0;
        local_180.size_ = -1;
        local_1b0.text_ = (char *)0x0;
        local_1b0.size_ = -1;
        local_1e0.text_ = (char *)0x0;
        local_1e0.size_ = -1;
        strings::Substitute_abi_cxx11_
                  (&local_230,(strings *)"Extension numbers cannot be greater than $0.",
                   (char *)&local_210,&local_60,&local_90,&local_c0,&local_f0,&local_120,&local_150,
                   &local_180,&local_1b0,&local_1e0,in_stack_fffffffffffffda8);
        AddError(this,element_name,&descriptor->super_Message,NUMBER,&local_230);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != &local_230.field_2) {
          operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
        }
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < *(int *)(message + 0x68));
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateMessageOptions(Descriptor* message,
                                               const DescriptorProto& proto) {
  VALIDATE_OPTIONS_FROM_ARRAY(message, field, Field);
  VALIDATE_OPTIONS_FROM_ARRAY(message, nested_type, Message);
  VALIDATE_OPTIONS_FROM_ARRAY(message, enum_type, Enum);
  VALIDATE_OPTIONS_FROM_ARRAY(message, extension, Field);

  const int64 max_extension_range =
      static_cast<int64>(message->options().message_set_wire_format() ?
                         kint32max :
                         FieldDescriptor::kMaxNumber);
  for (int i = 0; i < message->extension_range_count(); ++i) {
    if (message->extension_range(i)->end > max_extension_range + 1) {
      AddError(
          message->full_name(), proto.extension_range(i),
          DescriptorPool::ErrorCollector::NUMBER,
          strings::Substitute("Extension numbers cannot be greater than $0.",
                              max_extension_range));
    }
  }
}